

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ATN.hpp
# Opt level: O0

void __thiscall
Centaurus::ATNNode<unsigned_char>::ATNNode(ATNNode<unsigned_char> *this,Stream *stream)

{
  Stream *stream_local;
  ATNNode<unsigned_char> *this_local;
  
  this->_vptr_ATNNode = (_func_int **)&PTR__ATNNode_0028c730;
  std::
  vector<Centaurus::ATNTransition<unsigned_char>,_std::allocator<Centaurus::ATNTransition<unsigned_char>_>_>
  ::vector(&this->m_transitions);
  Identifier::Identifier(&this->m_invoke);
  NFA<unsigned_char>::NFA(&this->m_nfa);
  std::__cxx11::
  basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>::
  basic_string(&this->m_literal);
  parse(this,stream);
  return;
}

Assistant:

ATNNode(Stream& stream)
    {
        parse(stream);
    }